

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O2

double TasGrid::RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>(int max_order,int point,double x)

{
  double dVar1;
  double dVar2;
  
  dVar1 = scaleX<(TasGrid::RuleLocal::erule)3>(point,x);
  dVar2 = 0.0;
  if (ABS(dVar1) <= 1.0) {
    if (max_order == 3) {
      dVar1 = evalPWCubic<(TasGrid::RuleLocal::erule)3>(point,dVar1);
      return dVar1;
    }
    if (max_order == 2) {
      dVar2 = (dVar1 + 1.0) * (1.0 - dVar1);
    }
    else {
      if (max_order != 1) {
        dVar1 = evalPWPower<(TasGrid::RuleLocal::erule)3>(max_order,point,dVar1);
        return dVar1;
      }
      dVar2 = 1.0 - ABS(dVar1);
    }
  }
  return dVar2;
}

Assistant:

double evalRaw(int max_order, int point, double x) {
        switch(effective_rule) {
            case erule::pwc:
                return (std::abs(x - getNode<effective_rule>(point)) <= getSupport<effective_rule>(point)) ? 1.0 : 0.0;
            case erule::localp:
                if (point == 0) {
                    return 1.0;
                } else {
                    double xn = scaleX<effective_rule>(point, x);
                    if (std::abs(xn) <= 1.0) {
                        switch(max_order) {
                            case 1: return 1.0 - std::abs(xn);
                            case 2: return evalPWQuadratic<effective_rule>(point, xn);
                            case 3: return evalPWCubic<effective_rule>(point, xn);
                            default:
                                return evalPWPower<effective_rule>(max_order, point, xn);
                        };
                    } else {
                        return 0.0;
                    }
                }
            case erule::semilocalp:
                switch(point) {
                    case 0: return 1.0;
                    case 1: return 0.5 * x * (x - 1.0);
                    case 2: return 0.5 * x * (x + 1.0);
                    default: {
                        double xn = scaleX<effective_rule>(point, x);
                        if (std::abs(xn) <= 1.0) {
                            switch(max_order) {
                                case 1: return 1.0 - std::abs(xn);
                                case 2: return evalPWQuadratic<effective_rule>(point, xn);
                                case 3: return evalPWCubic<effective_rule>(point, xn);
                                default:
                                    return evalPWPower<effective_rule>(max_order, point, xn);
                            };
                        } else {
                            return 0.0;
                        }
                    }
                };
            case erule::localp0:
            default: { // case erule::localpb:
                    double xn = scaleX<effective_rule>(point, x);
                    if (std::abs(xn) <= 1.0) {
                        switch(max_order) {
                            case 1: return 1.0 - std::abs(xn);
                            case 2: return evalPWQuadratic<effective_rule>(point, xn);
                            case 3: return evalPWCubic<effective_rule>(point, xn);
                            default:
                                return evalPWPower<effective_rule>(max_order, point, xn);
                        };
                    } else {
                        return 0.0;
                    }
                }
        };
    }